

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week7-app4.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 local_90 [8];
  vector<int,_std::allocator<int>_> v;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  T_conflict local_40;
  int local_1c;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_1c = 5;
  local_18 = argv;
  argv_local._0_4_ = argc;
  $_0::operator()((__0 *)&func2,&local_1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"hello",&local_61);
  $_0::operator()(&local_40,(__0 *)&func2,&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  memset(local_90,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_90);
  argv_local._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
//    type_display< remove_modifiers<const int&>::type >();

    func2(5);
    func2(string("hello"));

    using K = decltype( func2(5) ); // unevaluated context
//    auto td = type_display< K >();

    auto v = std::vector<int>{};

    return 0;
}